

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

SchemaDraft
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::GetSchemaDraft(ValueType *document)

{
  char cVar1;
  char cVar2;
  ConstMemberIterator CVar3;
  char *pcVar4;
  char *pcVar5;
  SchemaDraft SVar6;
  UriType draftUri;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_b8;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_68;
  
  if ((document->data_).f.flags != 3) {
    return kDraftNone;
  }
  internal::
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  ::GetSchemaString();
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)&local_68,document);
  CVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberEnd(document);
  if ((Pointer)local_68.uri_ == CVar3.ptr_) {
    return kDraftNone;
  }
  if ((undefined1  [16])
      ((undefined1  [16])
       ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         *)((long)local_68.uri_ + 0x10))->data_ & (undefined1  [16])0x400000000000000) ==
      (undefined1  [16])0x0) {
    return kDraftUnknown;
  }
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
  ::
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
            ((GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
              *)&local_68,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)((long)local_68.uri_ + 0x10),(CrtAllocator *)0x0);
  local_b8.frag_ = (Ch *)0x0;
  local_b8.allocator_ = (CrtAllocator *)0x0;
  local_b8.path_ = (Ch *)0x0;
  local_b8.query_ = (Ch *)0x0;
  local_b8.scheme_ = (Ch *)0x0;
  local_b8.auth_ = (Ch *)0x0;
  local_b8.uri_ = (Ch *)0x0;
  local_b8.base_ = (char *)0x0;
  local_b8.ownAllocator_ = (CrtAllocator *)0x0;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::Parse(&local_b8,"http://json-schema.org/draft-04/schema#",0x27);
  if (local_68.base_ == local_b8.base_) {
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericUri(&local_b8);
    SVar6 = kDraft04;
  }
  else {
    if (local_b8.base_ == (char *)0x0 || local_68.base_ == (char *)0x0) {
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericUri(&local_b8);
    }
    else {
      cVar2 = *local_68.base_;
      pcVar4 = local_b8.base_;
      pcVar5 = local_68.base_;
      while ((cVar2 != '\0' && (pcVar5 = pcVar5 + 1, cVar2 == *pcVar4))) {
        pcVar4 = pcVar4 + 1;
        cVar2 = *pcVar5;
      }
      cVar1 = *pcVar4;
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericUri(&local_b8);
      SVar6 = kDraft04;
      if (cVar2 == cVar1) goto LAB_00125f4e;
    }
    local_b8.frag_ = (Ch *)0x0;
    local_b8.allocator_ = (CrtAllocator *)0x0;
    local_b8.path_ = (Ch *)0x0;
    local_b8.query_ = (Ch *)0x0;
    local_b8.scheme_ = (Ch *)0x0;
    local_b8.auth_ = (Ch *)0x0;
    local_b8.uri_ = (Ch *)0x0;
    local_b8.base_ = (char *)0x0;
    local_b8.ownAllocator_ = (CrtAllocator *)0x0;
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::Parse(&local_b8,"http://json-schema.org/draft-05/schema#",0x27);
    if (local_68.base_ == local_b8.base_) {
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericUri(&local_b8);
      SVar6 = kDraft05;
    }
    else {
      if (local_b8.base_ == (char *)0x0 || local_68.base_ == (char *)0x0) {
        GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::~GenericUri(&local_b8);
      }
      else {
        cVar2 = *local_68.base_;
        pcVar4 = local_b8.base_;
        pcVar5 = local_68.base_;
        while ((cVar2 != '\0' && (pcVar5 = pcVar5 + 1, cVar2 == *pcVar4))) {
          pcVar4 = pcVar4 + 1;
          cVar2 = *pcVar5;
        }
        cVar1 = *pcVar4;
        GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::~GenericUri(&local_b8);
        SVar6 = kDraft05;
        if (cVar2 == cVar1) goto LAB_00125f4e;
      }
      local_b8.frag_ = (Ch *)0x0;
      local_b8.allocator_ = (CrtAllocator *)0x0;
      local_b8.path_ = (Ch *)0x0;
      local_b8.query_ = (Ch *)0x0;
      local_b8.scheme_ = (Ch *)0x0;
      local_b8.auth_ = (Ch *)0x0;
      local_b8.uri_ = (Ch *)0x0;
      local_b8.base_ = (char *)0x0;
      local_b8.ownAllocator_ = (CrtAllocator *)0x0;
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::Parse(&local_b8,"http://json-schema.org/draft-06/schema#",0x27);
      if (local_68.base_ == local_b8.base_) {
        GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::~GenericUri(&local_b8);
        SVar6 = kDraft06;
      }
      else {
        if (local_b8.base_ == (char *)0x0 || local_68.base_ == (char *)0x0) {
          GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          ::~GenericUri(&local_b8);
        }
        else {
          cVar2 = *local_68.base_;
          pcVar4 = local_b8.base_;
          pcVar5 = local_68.base_;
          while ((cVar2 != '\0' && (pcVar5 = pcVar5 + 1, cVar2 == *pcVar4))) {
            pcVar4 = pcVar4 + 1;
            cVar2 = *pcVar5;
          }
          cVar1 = *pcVar4;
          GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          ::~GenericUri(&local_b8);
          SVar6 = kDraft06;
          if (cVar2 == cVar1) goto LAB_00125f4e;
        }
        GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::GenericUri(&local_b8,"http://json-schema.org/draft-07/schema#",(CrtAllocator *)0x0);
        if (local_68.base_ == local_b8.base_) {
          GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          ::~GenericUri(&local_b8);
          SVar6 = kDraft07;
        }
        else {
          if (local_b8.base_ == (char *)0x0 || local_68.base_ == (char *)0x0) {
            GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            ::~GenericUri(&local_b8);
          }
          else {
            cVar2 = *local_68.base_;
            pcVar4 = local_b8.base_;
            pcVar5 = local_68.base_;
            while ((cVar2 != '\0' && (pcVar5 = pcVar5 + 1, cVar2 == *pcVar4))) {
              pcVar4 = pcVar4 + 1;
              cVar2 = *pcVar5;
            }
            cVar1 = *pcVar4;
            GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            ::~GenericUri(&local_b8);
            SVar6 = kDraft07;
            if (cVar2 == cVar1) goto LAB_00125f4e;
          }
          GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          ::GenericUri(&local_b8,"http://json-schema.org/draft-03/schema#",(CrtAllocator *)0x0);
          if (local_68.base_ == local_b8.base_) {
            GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            ::~GenericUri(&local_b8);
            SVar6 = kDraft03;
          }
          else {
            if (local_b8.base_ == (char *)0x0 || local_68.base_ == (char *)0x0) {
              GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
              ::~GenericUri(&local_b8);
            }
            else {
              cVar2 = *local_68.base_;
              pcVar4 = local_b8.base_;
              pcVar5 = local_68.base_;
              while ((cVar2 != '\0' && (pcVar5 = pcVar5 + 1, cVar2 == *pcVar4))) {
                pcVar4 = pcVar4 + 1;
                cVar2 = *pcVar5;
              }
              cVar1 = *pcVar4;
              GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
              ::~GenericUri(&local_b8);
              SVar6 = kDraft03;
              if (cVar2 == cVar1) goto LAB_00125f4e;
            }
            GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            ::GenericUri(&local_b8,"https://json-schema.org/draft/2019-09/schema",
                         (CrtAllocator *)0x0);
            if (local_68.base_ == local_b8.base_) {
              GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
              ::~GenericUri(&local_b8);
              SVar6 = kDraft2019_09;
            }
            else {
              if (local_b8.base_ == (char *)0x0 || local_68.base_ == (char *)0x0) {
                GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                ::~GenericUri(&local_b8);
              }
              else {
                cVar2 = *local_68.base_;
                pcVar4 = local_b8.base_;
                pcVar5 = local_68.base_;
                while ((cVar2 != '\0' && (pcVar5 = pcVar5 + 1, cVar2 == *pcVar4))) {
                  pcVar4 = pcVar4 + 1;
                  cVar2 = *pcVar5;
                }
                cVar1 = *pcVar4;
                GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                ::~GenericUri(&local_b8);
                SVar6 = kDraft2019_09;
                if (cVar2 == cVar1) goto LAB_00125f4e;
              }
              GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
              ::GenericUri(&local_b8,"https://json-schema.org/draft/2020-12/schema",
                           (CrtAllocator *)0x0);
              if (local_68.base_ == local_b8.base_) {
                SVar6 = kDraft2020_12;
              }
              else {
                SVar6 = kDraftUnknown;
                if (local_b8.base_ != (char *)0x0 && local_68.base_ != (char *)0x0) {
                  cVar2 = *local_68.base_;
                  pcVar4 = local_b8.base_;
                  while ((cVar2 != '\0' && (local_68.base_ = local_68.base_ + 1, cVar2 == *pcVar4)))
                  {
                    pcVar4 = pcVar4 + 1;
                    cVar2 = *local_68.base_;
                  }
                  SVar6 = -(uint)(cVar2 != *pcVar4) | kDraft2020_12;
                }
              }
              GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
              ::~GenericUri(&local_b8);
            }
          }
        }
      }
    }
  }
LAB_00125f4e:
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::~GenericUri(&local_68);
  return SVar6;
}

Assistant:

static SchemaDraft GetSchemaDraft(const ValueType& document) {
        static const Ch kDraft03String[] = { 'h', 't', 't', 'p', ':', '/', '/', 'j', 's', 'o', 'n', '-', 's', 'c', 'h', 'e', 'm', 'a', '.', 'o', 'r', 'g', '/', 'd', 'r', 'a', 'f', 't', '-', '0', '3', '/', 's', 'c', 'h', 'e', 'm', 'a', '#', '\0' };
        static const Ch kDraft04String[] = { 'h', 't', 't', 'p', ':', '/', '/', 'j', 's', 'o', 'n', '-', 's', 'c', 'h', 'e', 'm', 'a', '.', 'o', 'r', 'g', '/', 'd', 'r', 'a', 'f', 't', '-', '0', '4', '/', 's', 'c', 'h', 'e', 'm', 'a', '#', '\0' };
        static const Ch kDraft05String[] = { 'h', 't', 't', 'p', ':', '/', '/', 'j', 's', 'o', 'n', '-', 's', 'c', 'h', 'e', 'm', 'a', '.', 'o', 'r', 'g', '/', 'd', 'r', 'a', 'f', 't', '-', '0', '5', '/', 's', 'c', 'h', 'e', 'm', 'a', '#', '\0' };
        static const Ch kDraft06String[] = { 'h', 't', 't', 'p', ':', '/', '/', 'j', 's', 'o', 'n', '-', 's', 'c', 'h', 'e', 'm', 'a', '.', 'o', 'r', 'g', '/', 'd', 'r', 'a', 'f', 't', '-', '0', '6', '/', 's', 'c', 'h', 'e', 'm', 'a', '#', '\0' };
        static const Ch kDraft07String[] = { 'h', 't', 't', 'p', ':', '/', '/', 'j', 's', 'o', 'n', '-', 's', 'c', 'h', 'e', 'm', 'a', '.', 'o', 'r', 'g', '/', 'd', 'r', 'a', 'f', 't', '-', '0', '7', '/', 's', 'c', 'h', 'e', 'm', 'a', '#', '\0' };
        static const Ch kDraft2019_09String[] = { 'h', 't', 't', 'p', 's', ':', '/', '/', 'j', 's', 'o', 'n', '-', 's', 'c', 'h', 'e', 'm', 'a', '.', 'o', 'r', 'g', '/', 'd', 'r', 'a', 'f', 't', '/', '2', '0', '1', '9', '-', '0', '9', '/', 's', 'c', 'h', 'e', 'm', 'a', '\0' };
        static const Ch kDraft2020_12String[] = { 'h', 't', 't', 'p', 's', ':', '/', '/', 'j', 's', 'o', 'n', '-', 's', 'c', 'h', 'e', 'm', 'a', '.', 'o', 'r', 'g', '/', 'd', 'r', 'a', 'f', 't', '/', '2', '0', '2', '0', '-', '1', '2', '/', 's', 'c', 'h', 'e', 'm', 'a', '\0' };

        if (!document.IsObject()) {
            return kDraftNone;
        }

        // Get the schema draft from the $schema keyword at the supplied location
        typename ValueType::ConstMemberIterator itr = document.FindMember(SchemaType::GetSchemaString());
        if (itr != document.MemberEnd()) {
            if (!itr->value.IsString()) return kDraftUnknown;
            const UriType draftUri(itr->value);
            // Check base uri for match
            if (draftUri.Match(UriType(kDraft04String), false)) return kDraft04;
            if (draftUri.Match(UriType(kDraft05String), false)) return kDraft05;
            if (draftUri.Match(UriType(kDraft06String), false)) return kDraft06;
            if (draftUri.Match(UriType(kDraft07String), false)) return kDraft07;
            if (draftUri.Match(UriType(kDraft03String), false)) return kDraft03;
            if (draftUri.Match(UriType(kDraft2019_09String), false)) return kDraft2019_09;
            if (draftUri.Match(UriType(kDraft2020_12String), false)) return kDraft2020_12;
            return kDraftUnknown;
        }
        // $schema not found
        return kDraftNone;
    }